

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O0

ON_Layer *
ON_Layer::FromModelComponentRef
          (ON_ModelComponentReference *model_component_reference,ON_Layer *none_return_value)

{
  ON_ModelComponent *p_00;
  ON_Layer *pOVar1;
  ON_Layer *local_28;
  ON_Layer *p;
  ON_Layer *none_return_value_local;
  ON_ModelComponentReference *model_component_reference_local;
  
  p_00 = ON_ModelComponentReference::ModelComponent(model_component_reference);
  pOVar1 = Cast(&p_00->super_ON_Object);
  local_28 = none_return_value;
  if (pOVar1 != (ON_Layer *)0x0) {
    local_28 = pOVar1;
  }
  return local_28;
}

Assistant:

const ON_Layer* ON_Layer::FromModelComponentRef(
  const class ON_ModelComponentReference& model_component_reference,
  const ON_Layer* none_return_value
  )
{
  const ON_Layer* p = ON_Layer::Cast(model_component_reference.ModelComponent());
  return (nullptr != p) ? p : none_return_value;
}